

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O3

void __thiscall mp::BasicSolver::PrintWarnings(BasicSolver *this)

{
  string warnings;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  undefined8 local_38;
  undefined8 uStack_30;
  ArgList local_20;
  
  GetWarnings_abi_cxx11_(&local_58,this);
  if (local_58._M_string_length != 0) {
    std::operator+(&local_78,'\n',&local_58);
    local_20.field_1.values_ = (Value *)&local_38;
    local_38 = 0;
    uStack_30 = 0;
    local_20.types_ = 0;
    Print(this,(CStringRef)local_78._M_dataplus._M_p,&local_20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void BasicSolver::PrintWarnings() {
  auto warnings = GetWarnings();
  if (warnings.size())
    Print('\n' + warnings);
}